

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O1

void Js::ByteCodeDumper::
     DumpReg3B1<Js::OpLayoutT_Reg3B1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
               (OpCode op,OpLayoutT_Reg3B1<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  Output::Print(L" R%d ",(ulong)data->R0);
  Output::Print(L" R%d ",(ulong)data->R1);
  Output::Print(L" R%d ",(ulong)data->R2);
  Output::Print(L" int:%d ",(ulong)data->B3);
  return;
}

Assistant:

void
    ByteCodeDumper::DumpReg3B1(OpCode op, const unaligned T * data, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        DumpReg(data->R0);
        DumpReg(data->R1);
        DumpReg(data->R2);
        DumpI4(data->B3);
    }